

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGlobalGenerator *pcVar3;
  pointer pcVar4;
  TargetType TVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  pointer ppcVar13;
  pointer ppcVar14;
  string currentDir;
  string makeArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string fastTarget;
  string make;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string local_100;
  cmExtraKateGenerator *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  int local_54;
  pointer local_50;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_48;
  
  pcVar2 = lg->Makefile;
  local_e0 = this;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"CMAKE_MAKE_PROGRAM","");
  pcVar7 = cmMakefile::GetRequiredDefinition(pcVar2,&local_d8);
  std::__cxx11::string::string((string *)&local_78,pcVar7,(allocator *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"CMAKE_KATE_MAKE_ARGUMENTS","");
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_100);
  std::__cxx11::string::string((string *)&local_d8,pcVar7,(allocator *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"",0x1c);
  pcVar8 = cmLocalGenerator::GetBinaryDirectory(lg);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)fout +
                    (int)(fout->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,pcVar8,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n",0x39);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"build\": \"",0xc);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)fout,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," -C \\\"",6);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\\\" ",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"all\",\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"clean\": \"",0xc);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)fout,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," -C \\\"",6);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\\\" ",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"clean\",\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"quick\": \"",0xc);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)fout,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," -C \\\"",6);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
  }
  else {
    sVar9 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\\\" ",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"install\",\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\"targets\":[\n",0xe);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"all","");
  std::__cxx11::string::string((string *)&local_b8,pcVar7,(allocator *)&local_98);
  AppendTarget(local_e0,fout,&local_100,&local_78,&local_d8,&local_b8,pcVar7);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"clean","");
  std::__cxx11::string::string((string *)&local_b8,pcVar7,(allocator *)&local_98);
  AppendTarget(local_e0,fout,&local_100,&local_78,&local_d8,&local_b8,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = (local_e0->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar13 = (pcVar3->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar13 !=
      (pcVar3->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                (&local_48,&(*ppcVar13)->GeneratorTargets);
      pcVar8 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar13);
      std::__cxx11::string::string((string *)&local_100,pcVar8,(allocator *)&local_b8);
      local_50 = ppcVar13;
      cmLocalGenerator::GetBinaryDirectory(*ppcVar13);
      local_54 = std::__cxx11::string::compare((char *)&local_100);
      for (ppcVar14 = local_48.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          ppcVar14 !=
          local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; ppcVar14 = ppcVar14 + 1) {
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar14);
        pcVar4 = (psVar11->_M_dataplus)._M_p;
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar4,pcVar4 + psVar11->_M_string_length);
        TVar5 = cmGeneratorTarget::GetType(*ppcVar14);
        if (TVar5 < UTILITY) {
          AppendTarget(local_e0,fout,&local_b8,&local_78,&local_d8,&local_100,pcVar7);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_b8._M_dataplus._M_p,
                     local_b8._M_dataplus._M_p + local_b8._M_string_length);
          std::__cxx11::string::append((char *)&local_98);
          AppendTarget(local_e0,fout,&local_98,&local_78,&local_d8,&local_100,pcVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else if (TVar5 == UTILITY) {
          lVar12 = std::__cxx11::string::find((char *)&local_b8,0x6290ea,0);
          if ((((lVar12 != 0) ||
               (iVar6 = std::__cxx11::string::compare((char *)&local_b8), iVar6 == 0)) &&
              ((lVar12 = std::__cxx11::string::find((char *)&local_b8,0x628fe6,0), lVar12 != 0 ||
               (iVar6 = std::__cxx11::string::compare((char *)&local_b8), iVar6 == 0)))) &&
             ((lVar12 = std::__cxx11::string::find((char *)&local_b8,0x629065,0), lVar12 != 0 ||
              (iVar6 = std::__cxx11::string::compare((char *)&local_b8), iVar6 == 0)))) {
            AppendTarget(local_e0,fout,&local_b8,&local_78,&local_d8,&local_100,pcVar7);
          }
        }
        else if ((TVar5 == GLOBAL_TARGET) && (local_54 == 0)) {
          iVar6 = std::__cxx11::string::compare((char *)&local_b8);
          if (iVar6 == 0) {
            pcVar2 = (*local_50)->Makefile;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"CMAKE_EDIT_COMMAND","");
            pcVar8 = cmMakefile::GetDefinition(pcVar2,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((pcVar8 == (char *)0x0) || (pcVar8 = strstr(pcVar8,"ccmake"), pcVar8 != (char *)0x0)
               ) goto LAB_004800ae;
          }
          AppendTarget(local_e0,fout,&local_b8,&local_78,&local_d8,&local_100,pcVar7);
        }
LAB_004800ae:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      ppcVar13 = local_50;
      if (local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      ppcVar13 = ppcVar13 + 1;
    } while (ppcVar13 !=
             (((local_e0->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
             LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t] }\n",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                        cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs =
    mf->GetSafeDefinition("CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = lg->GetBinaryDirectory();

  /* clang-format off */
  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << lg->GetBinaryDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";
  /* clang-format on */

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir << "\\\" "
       << makeArgs << " "
       << "install\",\n";

  // this is for kate >= 4.13:
  fout << "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs, homeOutputDir,
                     homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs, homeOutputDir,
                     homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator it =
         this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end(); ++it) {
    const std::vector<cmGeneratorTarget*> targets =
      (*it)->GetGeneratorTargets();
    std::string currentDir = (*it)->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == (*it)->GetBinaryDirectory());

    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      std::string targetName = (*ti)->GetName();
      switch ((*ti)->GetType()) {
        case cmStateEnums::GLOBAL_TARGET: {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel) {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache") {
              const char* editCommand =
                (*it)->GetMakefile()->GetDefinition("CMAKE_EDIT_COMMAND");
              if (editCommand == CM_NULLPTR) {
                insertTarget = false;
              } else if (strstr(editCommand, "ccmake") != CM_NULLPTR) {
                insertTarget = false;
              }
            }
          }
          if (insertTarget) {
            this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                               homeOutputDir);
          }
        } break;
        case cmStateEnums::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly") == 0) &&
               (targetName != "Nightly")) ||
              ((targetName.find("Continuous") == 0) &&
               (targetName != "Continuous")) ||
              ((targetName.find("Experimental") == 0) &&
               (targetName != "Experimental"))) {
            break;
          }

          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          break;
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          this->AppendTarget(fout, targetName, make, makeArgs, currentDir,
                             homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs, currentDir,
                             homeOutputDir);

        } break;
        default:
          break;
      }
    }

    // insert rules for compiling, preprocessing and assembling individual
    // files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for (std::vector<std::string>::const_iterator fit =
           objectFileTargets.begin();
         fit != objectFileTargets.end(); ++fit) {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,
                         homeOutputDir);
    }
  }

  fout << "\t] }\n";
}